

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# createdfd.c
# Opt level: O2

uint32_t *
createDFDPackedShifted
          (int bigEndian,int numChannels,int *bits,int *shiftBits,int *channels,VkSuffix suffix)

{
  int bits_00;
  int sampleNo;
  uint32_t *DFD;
  ulong uVar1;
  int bits_01;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  int beChannelStart [4];
  int bitChannel [32];
  
  if (numChannels == 6) {
    DFD = writeHeader(6,4,7,i_COLOR);
    DFD[7] = 0x80000;
    DFD[8] = 0;
    DFD[9] = 0;
    DFD[10] = 0x2100;
    DFD[0xb] = 0x2004001b;
    DFD[0xc] = 0;
    DFD[0xd] = 0xf;
    DFD[0xe] = 0x1f;
    DFD[0xf] = 0x1080009;
    DFD[0x10] = 0;
    DFD[0x11] = 0;
    DFD[0x12] = 0x2100;
    DFD[0x13] = 0x2104001b;
    DFD[0x14] = 0;
    DFD[0x15] = 0xf;
    DFD[0x16] = 0x1f;
    DFD[0x17] = 0x2080012;
    DFD[0x18] = 0;
    DFD[0x19] = 0;
    DFD[0x1a] = 0x2100;
    DFD[0x1b] = 0x2204001b;
    DFD[0x1c] = 0;
    DFD[0x1d] = 0xf;
    DFD[0x1e] = 0x1f;
  }
  else {
    uVar2 = 0;
    if (bigEndian == 0) {
      uVar1 = 0;
      if (0 < numChannels) {
        uVar1 = (ulong)(uint)numChannels;
      }
      iVar8 = 0;
      for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
        iVar8 = iVar8 + shiftBits[uVar2] + bits[uVar2];
      }
      DFD = writeHeader(numChannels,iVar8 >> 3,suffix,i_COLOR);
      iVar8 = 0;
      for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
        iVar5 = shiftBits[uVar2];
        writeSample(DFD,(int)uVar2,channels[uVar2],bits[uVar2],iVar8 + iVar5,1,1,suffix);
        iVar8 = iVar8 + iVar5 + bits[uVar2];
      }
    }
    else {
      uVar1 = 0;
      if (0 < numChannels) {
        uVar1 = (ulong)(uint)numChannels;
      }
      iVar8 = 0;
      for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
        beChannelStart[uVar2] = iVar8;
        iVar8 = iVar8 + shiftBits[uVar2] + bits[uVar2];
      }
      uVar4 = iVar8 - 1U & 0x18;
      iVar5 = 0;
      for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
        uVar3 = iVar5 + shiftBits[uVar2];
        bitChannel[(int)(uVar3 ^ uVar4)] = (int)uVar2;
        iVar5 = bits[uVar2];
        uVar6 = (iVar5 + uVar3) - 1 & 0xfffffff8;
        if (uVar6 != (uVar3 & 0xfffffff8)) {
          bitChannel[(int)(uVar6 ^ uVar4)] = (int)uVar2;
          numChannels = numChannels + 1;
        }
        iVar5 = iVar5 + uVar3;
      }
      uVar3 = 0;
      DFD = writeHeader(numChannels,iVar8 >> 3,suffix,i_COLOR);
      iVar5 = 0;
      while ((int)uVar3 < iVar8) {
        lVar7 = (long)bitChannel[(int)uVar3];
        if (lVar7 == -1) {
          uVar3 = (uVar3 & 0xfffffff8) + 8;
        }
        else {
          uVar6 = beChannelStart[lVar7] ^ uVar4;
          if (uVar6 == uVar3) {
            writeSample(DFD,iVar5,channels[lVar7],bits[lVar7],uVar3,1,1,suffix);
            bits_00 = bits[lVar7];
            iVar5 = iVar5 + 1;
          }
          else {
            bits_01 = 8 - (beChannelStart[lVar7] & 7U);
            bits_00 = bits[lVar7] - bits_01;
            sampleNo = iVar5 + 1;
            writeSample(DFD,iVar5,channels[lVar7],bits_01,uVar6,0,1,suffix);
            bitChannel[(int)uVar6] = -1;
            iVar5 = iVar5 + 2;
            writeSample(DFD,sampleNo,channels[lVar7],bits_00,uVar3,1,0,suffix);
          }
          uVar3 = uVar3 + bits_00;
        }
      }
    }
  }
  return DFD;
}

Assistant:

uint32_t *createDFDPackedShifted(int bigEndian, int numChannels,
                                 int bits[], int shiftBits[], int channels[],
                                 enum VkSuffix suffix)
{
    uint32_t *DFD = 0;
    if (numChannels == 6) {
        /* Special case E5B9G9R9 */
        DFD = writeHeader(numChannels, 4, s_UFLOAT, i_COLOR);
        writeSample(DFD, 0, 0,
                    9, 0,
                    1, 1, s_UNORM);
        KHR_DFDSETSVAL((DFD+1), 0, SAMPLEUPPER, 8448);
        writeSample(DFD, 1, 0 | KHR_DF_SAMPLE_DATATYPE_EXPONENT,
                    5, 27,
                    1, 1, s_UNORM);
        KHR_DFDSETSVAL((DFD+1), 1, SAMPLELOWER, 15);
        KHR_DFDSETSVAL((DFD+1), 1, SAMPLEUPPER, 31);
        writeSample(DFD, 2, 1,
                    9, 9,
                    1, 1, s_UNORM);
        KHR_DFDSETSVAL((DFD+1), 2, SAMPLEUPPER, 8448);
        writeSample(DFD, 3, 1 | KHR_DF_SAMPLE_DATATYPE_EXPONENT,
                    5, 27,
                    1, 1, s_UNORM);
        KHR_DFDSETSVAL((DFD+1), 3, SAMPLELOWER, 15);
        KHR_DFDSETSVAL((DFD+1), 3, SAMPLEUPPER, 31);
        writeSample(DFD, 4, 2,
                    9, 18,
                    1, 1, s_UNORM);
        KHR_DFDSETSVAL((DFD+1), 4, SAMPLEUPPER, 8448);
        writeSample(DFD, 5, 2 | KHR_DF_SAMPLE_DATATYPE_EXPONENT,
                    5, 27,
                    1, 1, s_UNORM);
        KHR_DFDSETSVAL((DFD+1), 5, SAMPLELOWER, 15);
        KHR_DFDSETSVAL((DFD+1), 5, SAMPLEUPPER, 31);
    } else if (bigEndian) {
        /* No packed format is larger than 32 bits. */
        /* No packed channel crosses more than two bytes. */
        int totalBits = 0;
        int bitChannel[32];
        int beChannelStart[4];
        int channelCounter;
        int bitOffset = 0;
        int BEMask;
        int numSamples = numChannels;
        int sampleCounter;
        for (channelCounter = 0; channelCounter < numChannels; ++channelCounter) {
            beChannelStart[channelCounter] = totalBits;
            totalBits += shiftBits[channelCounter] + bits[channelCounter];
        }
        BEMask = (totalBits - 1) & 0x18;
        for (channelCounter = 0; channelCounter < numChannels; ++channelCounter) {
            bitOffset += shiftBits[channelCounter];
            bitChannel[bitOffset ^ BEMask] = channelCounter;
            if (((bitOffset + bits[channelCounter] - 1) & ~7) != (bitOffset & ~7)) {
                /* Continuation sample */
                bitChannel[((bitOffset + bits[channelCounter] - 1) & ~7) ^ BEMask] = channelCounter;
                numSamples++;
            }
            bitOffset += bits[channelCounter];
        }
        DFD = writeHeader(numSamples, totalBits >> 3, suffix, i_COLOR);

        sampleCounter = 0;
        for (bitOffset = 0; bitOffset < totalBits;) {
            if (bitChannel[bitOffset] == -1) {
                /* Done this bit, so this is the lower half of something. */
                /* We must therefore jump to the end of the byte and continue. */
                bitOffset = (bitOffset + 8) & ~7;
            } else {
                /* Start of a channel? */
                int thisChannel = bitChannel[bitOffset];
                if ((beChannelStart[thisChannel] ^ BEMask) == bitOffset) {
                    /* Must be just one sample if we hit it first. */
                    writeSample(DFD, sampleCounter++, channels[thisChannel],
                                    bits[thisChannel], bitOffset,
                                    1, 1, suffix);
                    bitOffset += bits[thisChannel];
                } else {
                    /* Two samples. Move to the end of the first one we hit when we're done. */
                    int firstSampleBits = 8 - (beChannelStart[thisChannel] & 0x7); /* Rest of the byte */
                    int secondSampleBits = bits[thisChannel] - firstSampleBits; /* Rest of the bits */
                    writeSample(DFD, sampleCounter++, channels[thisChannel],
                                firstSampleBits, beChannelStart[thisChannel] ^ BEMask,
                                0, 1, suffix);
                    /* Mark that we've already handled this sample */
                    bitChannel[beChannelStart[thisChannel] ^ BEMask] = -1;
                    writeSample(DFD, sampleCounter++, channels[thisChannel],
                                secondSampleBits, bitOffset,
                                1, 0, suffix);
                    bitOffset += secondSampleBits;
                }
            }
        }

    } else { /* Little-endian */

        int sampleCounter;
        int totalBits = 0;
        int bitOffset = 0;
        for (sampleCounter = 0; sampleCounter < numChannels; ++sampleCounter) {
            totalBits += shiftBits[sampleCounter] + bits[sampleCounter];
        }

        /* One sample per channel */
        DFD = writeHeader(numChannels, totalBits >> 3, suffix, i_COLOR);
        for (sampleCounter = 0; sampleCounter < numChannels; ++sampleCounter) {
            bitOffset += shiftBits[sampleCounter];
            writeSample(DFD, sampleCounter, channels[sampleCounter],
                        bits[sampleCounter], bitOffset,
                        1, 1, suffix);
            bitOffset += bits[sampleCounter];
        }
    }
    return DFD;
}